

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxa_demangle.cpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_> *
__thiscall
__cxxabiv1::(anonymous_namespace)::
base_name<std::__cxx11::basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>>
          (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          *s)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  malloc_alloc<char> *extraout_RDX;
  malloc_alloc<char> *extraout_RDX_00;
  malloc_alloc<char> *extraout_RDX_01;
  malloc_alloc<char> *extraout_RDX_02;
  malloc_alloc<char> *__a;
  char *pcVar5;
  char *pcVar6;
  
  if (*(long *)(this + 8) == 0) {
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
    ::basic_string(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                    *)this);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                             *)this,"std::string");
    if (bVar2) {
      std::__cxx11::
      basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
      ::operator=((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                   *)this,"std::basic_string<char, std::char_traits<char>, std::allocator<char> >");
      pcVar6 = "basic_string";
      __a = extraout_RDX;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                               *)this,"std::istream");
      if (bVar2) {
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
        ::operator=((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                     *)this,"std::basic_istream<char, std::char_traits<char> >");
        pcVar6 = "basic_istream";
        __a = extraout_RDX_00;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                                 *)this,"std::ostream");
        if (bVar2) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::operator=((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                       *)this,"std::basic_ostream<char, std::char_traits<char> >");
          pcVar6 = "basic_ostream";
          __a = extraout_RDX_01;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                                   *)this,"std::iostream");
          if (!bVar2) {
            pcVar1 = *(char **)this;
            pcVar6 = pcVar1 + *(long *)(this + 8);
            pcVar5 = pcVar6;
            if (pcVar1[*(long *)(this + 8) + -1] == '>') {
              iVar3 = 1;
LAB_00191d4e:
              do {
                pcVar5 = pcVar6 + -1;
                do {
                  pcVar6 = pcVar5;
                  if (pcVar6 == pcVar1) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    __return_storage_ptr__->_M_string_length = 0;
                    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                    return __return_storage_ptr__;
                  }
                  pcVar5 = pcVar6 + -1;
                  if (pcVar6[-1] == '>') {
                    iVar3 = iVar3 + 1;
                    goto LAB_00191d4e;
                  }
                } while (pcVar6[-1] != '<');
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
            do {
              pcVar4 = pcVar5 + -1;
              pcVar6 = pcVar1;
              if (pcVar4 == pcVar1) break;
              pcVar6 = pcVar5;
              pcVar5 = pcVar4;
            } while (*pcVar4 != ':');
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::
            basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
            ::_M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                        *)__return_storage_ptr__,pcVar6);
            return __return_storage_ptr__;
          }
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
          ::operator=((basic_string<char,_std::char_traits<char>,___cxxabiv1::(anonymous_namespace)::malloc_alloc<char>_>
                       *)this,"std::basic_iostream<char, std::char_traits<char> >");
          pcVar6 = "basic_iostream";
          __a = extraout_RDX_02;
        }
      }
    }
    std::__cxx11::
    basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
    ::basic_string<__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
              ((basic_string<char,std::char_traits<char>,__cxxabiv1::(anonymous_namespace)::malloc_alloc<char>>
                *)__return_storage_ptr__,pcVar6,__a);
  }
  return __return_storage_ptr__;
}

Assistant:

String
base_name(String& s)
{
    if (s.empty())
        return s;
    if (s == "std::string")
    {
        s = "std::basic_string<char, std::char_traits<char>, std::allocator<char> >";
        return "basic_string";
    }
    if (s == "std::istream")
    {
        s = "std::basic_istream<char, std::char_traits<char> >";
        return "basic_istream";
    }
    if (s == "std::ostream")
    {
        s = "std::basic_ostream<char, std::char_traits<char> >";
        return "basic_ostream";
    }
    if (s == "std::iostream")
    {
        s = "std::basic_iostream<char, std::char_traits<char> >";
        return "basic_iostream";
    }
    const char* const pf = s.data();
    const char* pe = pf + s.size();
    if (pe[-1] == '>')
    {
        unsigned c = 1;
        while (true)
        {
            if (--pe == pf)
                return String();
            if (pe[-1] == '<')
            {
                if (--c == 0)
                {
                    --pe;
                    break;
                }
            }
            else if (pe[-1] == '>')
                ++c;
        }
    }
    const char* p0 = pe - 1;
    for (; p0 != pf; --p0)
    {
        if (*p0 == ':')
        {
            ++p0;
            break;
        }
    }
    return String(p0, pe);
}